

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void CTPNConst::s_gen_code_str(char *str,size_t len)

{
  int iVar1;
  int iVar2;
  CTcGenTarg *this;
  CTcCodeStream *__n;
  char buf [4];
  undefined4 local_1c;
  
  CTcGenTarg::write_op(G_cg,'\x05');
  this = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (this->max_sp_depth_ <= iVar2) {
    this->max_sp_depth_ = iVar1;
  }
  __n = G_cs;
  CTcGenTarg::add_const_str
            (this,str,len,&G_cs->super_CTcDataStream,(G_cs->super_CTcDataStream).ofs_);
  local_1c = 0;
  CTcDataStream::write(&G_cs->super_CTcDataStream,(int)&local_1c,(void *)0x4,(size_t)__n);
  return;
}

Assistant:

void CTPNConst::s_gen_code_str(const char *str, size_t len)
{
    /* write the instruction to push a constant pool string */
    G_cg->write_op(OPC_PUSHSTR);

    /* note the push */
    G_cg->note_push();

    /* 
     *   add the string to the constant pool, creating a fixup at the current
     *   code stream location 
     */
    G_cg->add_const_str(str, len, G_cs, G_cs->get_ofs());

    /* 
     *   write a placeholder address - this will be corrected by the fixup
     *   that add_const_str() created for us 
     */
    G_cs->write4(0);
}